

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

void upack_loc(char **buf,LocMsg *lmsg)

{
  ck_uint32 cVar1;
  char *pcVar2;
  
  pcVar2 = upack_str(buf);
  lmsg->file = pcVar2;
  cVar1 = upack_int(buf);
  if (-1 < (int)cVar1) {
    lmsg->line = cVar1;
    return;
  }
  eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x13f,(ulong)cVar1,0x7fffffff);
}

Assistant:

static void upack_loc(char **buf, LocMsg * lmsg)
{
    ck_uint32 line;
    lmsg->file = upack_str(buf);
    line = upack_int(buf);
    if(line > INT_MAX)
        eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
                __FILE__, __LINE__ - 3, line, INT_MAX);
    lmsg->line = (int) line;
}